

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O1

string * __thiscall
LinearRegression::generateGradients_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  undefined8 *puVar1;
  bool bVar2;
  pointer pPVar3;
  LinearRegression *this_00;
  string *__return_storage_ptr___00;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  View *pVVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pPVar13;
  char cVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  ulong uVar17;
  pointer ppVar18;
  pointer ppVar19;
  size_t sVar20;
  pointer pAVar21;
  string __str_2;
  string labelStr;
  string __str_1;
  string __str;
  string errorString;
  string gradString;
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  actualGradients;
  ulong *local_450;
  long local_448;
  ulong local_440;
  long lStack_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  long local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  ulong *local_410;
  long local_408;
  ulong local_400;
  long lStack_3f8;
  LinearRegression *local_3f0;
  ulong *local_3e8;
  long local_3e0;
  ulong local_3d8;
  long lStack_3d0;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  byte local_341;
  ulong *local_340;
  long local_338;
  ulong local_330;
  long lStack_328;
  ulong *local_320;
  long local_318;
  ulong local_310;
  undefined8 uStack_308;
  size_t local_300;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  long lStack_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a8;
  undefined8 local_298;
  size_t local_290;
  long local_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230;
  long lStack_228;
  ulong *local_220;
  long local_218;
  ulong local_210;
  long lStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0 [2];
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0 [2];
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  local_100;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  string *local_68;
  ulong local_60;
  pointer local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_68 = __return_storage_ptr__;
  local_290 = QueryCompiler::numberOfViews
                        ((this->_compiler).
                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  ::vector(&local_100,local_290,(allocator_type *)local_2b8);
  pPVar3 = partialGradients.super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (partialGradients.super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>._M_impl
      .super__Vector_impl_data._M_start !=
      partialGradients.super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    pPVar13 = partialGradients.super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      plVar5 = *(long **)&((*(pPVar13->query->_aggregates).
                             super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                             super__Vector_impl_data._M_start)->_incoming).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl;
      local_2b8._8_8_ = (pointer)0x0;
      aStack_2a8._M_allocated_capacity = 0;
      aStack_2a8._8_8_ = (pointer)0x0;
      local_2b8._0_8_ = plVar5[1];
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)(local_2b8 + 8),&pPVar13->inputVariables);
      std::vector<ActualGradient,_std::allocator<ActualGradient>_>::push_back
                (local_100.
                 super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *plVar5,(value_type *)local_2b8);
      if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2b8._8_8_);
      }
      pPVar13 = pPVar13 + 1;
    } while (pPVar13 != pPVar3);
  }
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3a8,'\x03');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_3c8.field_2._M_allocated_capacity = *puVar9;
    local_3c8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_3c8.field_2._M_allocated_capacity = *puVar9;
    local_3c8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_3c8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_388,'\x03');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    uVar15 = local_3c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      uVar15 = local_388.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length) goto LAB_00139139;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_388,0,(char *)0x0,(ulong)local_3c8._M_dataplus._M_p);
  }
  else {
LAB_00139139:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_388._M_dataplus._M_p);
  }
  local_3e8 = &local_3d8;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_3d8 = *puVar9;
    lStack_3d0 = puVar6[3];
  }
  else {
    local_3d8 = *puVar9;
    local_3e8 = (ulong *)*puVar6;
  }
  local_3e0 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3e8);
  local_430 = &local_420;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar8) {
    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_420._8_8_ = plVar5[3];
  }
  else {
    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5;
  }
  local_428 = plVar5[1];
  *plVar5 = (long)paVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_368,'\x06');
  uVar15 = 0xf;
  if (local_430 != &local_420) {
    uVar15 = local_420._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_368._M_string_length + local_428) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      uVar15 = local_368.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_368._M_string_length + local_428) goto LAB_0013927a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_430);
  }
  else {
LAB_0013927a:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_368._M_dataplus._M_p);
  }
  local_450 = &local_440;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_440 = *puVar9;
    lStack_438 = puVar6[3];
  }
  else {
    local_440 = *puVar9;
    local_450 = (ulong *)*puVar6;
  }
  local_448 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_400 = *puVar9;
    lStack_3f8 = puVar6[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *puVar9;
    local_410 = (ulong *)*puVar6;
  }
  local_408 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_3f0 = this;
  local_340 = &local_330;
  std::__cxx11::string::_M_construct((ulong)&local_340,'\x01');
  *(undefined1 *)local_340 = 0x38;
  uVar17 = 0xf;
  if (local_410 != &local_400) {
    uVar17 = local_400;
  }
  if (uVar17 < (ulong)(local_338 + local_408)) {
    uVar17 = 0xf;
    if (local_340 != &local_330) {
      uVar17 = local_330;
    }
    if (uVar17 < (ulong)(local_338 + local_408)) goto LAB_001393b3;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,(ulong)local_410);
  }
  else {
LAB_001393b3:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_340);
  }
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  psVar10 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
    local_2d8.field_2._8_8_ = puVar6[3];
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
    local_2d8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_2d8._M_string_length = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8._0_8_ = &aStack_2a8;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar8) {
    aStack_2a8._M_allocated_capacity = paVar8->_M_allocated_capacity;
    aStack_2a8._8_8_ = plVar5[3];
  }
  else {
    aStack_2a8._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_2b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar5;
  }
  local_2b8._8_8_ = plVar5[1];
  *plVar5 = (long)paVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3c8,'\x03');
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c8);
  local_3e8 = &local_3d8;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_3d8 = *puVar9;
    lStack_3d0 = puVar6[3];
  }
  else {
    local_3d8 = *puVar9;
    local_3e8 = (ulong *)*puVar6;
  }
  local_3e0 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3a8,'\x03');
  uVar17 = 0xf;
  if (local_3e8 != &local_3d8) {
    uVar17 = local_3d8;
  }
  if (uVar17 < local_3a8._M_string_length + local_3e0) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      uVar15 = local_3a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_3a8._M_string_length + local_3e0) goto LAB_00139669;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,(ulong)local_3e8);
  }
  else {
LAB_00139669:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_3a8._M_dataplus._M_p);
  }
  local_430 = &local_420;
  psVar10 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_420._M_allocated_capacity = *psVar10;
    local_420._8_8_ = puVar6[3];
  }
  else {
    local_420._M_allocated_capacity = *psVar10;
    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6;
  }
  local_428 = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_430);
  local_450 = &local_440;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_440 = *puVar9;
    lStack_438 = puVar6[3];
  }
  else {
    local_440 = *puVar9;
    local_450 = (ulong *)*puVar6;
  }
  local_448 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_388,'\x06');
  uVar17 = 0xf;
  if (local_450 != &local_440) {
    uVar17 = local_440;
  }
  if (uVar17 < local_388._M_string_length + local_448) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      uVar15 = local_388.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_388._M_string_length + local_448) goto LAB_001397a2;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_450);
  }
  else {
LAB_001397a2:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_388._M_dataplus._M_p);
  }
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_400 = *puVar9;
    lStack_3f8 = puVar6[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *puVar9;
    local_410 = (ulong *)*puVar6;
  }
  local_408 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_410);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
    local_2d8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
    local_2d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if (local_290 != 0) {
    uVar17 = 0;
    do {
      pVVar7 = QueryCompiler::getView
                         ((local_3f0->_compiler).
                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar17);
      local_341 = true;
      if ((pVVar7->_fVars).super__Base_bitset<2UL>._M_w[0] == 0) {
        bVar2 = true;
        do {
          local_341 = bVar2;
          if (!(bool)local_341) break;
          bVar2 = false;
        } while ((pVVar7->_fVars).super__Base_bitset<2UL>._M_w[1] == 0);
      }
      local_288 = uVar17 * 3;
      local_298 = 9;
      local_60 = uVar17;
      if (local_100.
          super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar17].
          super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_100.
          super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar17].
          super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if ((bool)local_341 == false) {
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_3a8,'\x06');
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_3a8);
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          puVar9 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_3c8.field_2._M_allocated_capacity = *puVar9;
            local_3c8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_3c8.field_2._M_allocated_capacity = *puVar9;
            local_3c8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_3c8._M_string_length = plVar5[1];
          *plVar5 = (long)puVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          cVar14 = '\x01';
          if (9 < uVar17) {
            uVar11 = uVar17;
            cVar4 = '\x04';
            do {
              cVar14 = cVar4;
              if (uVar11 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_00139d80;
              }
              if (uVar11 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_00139d80;
              }
              if (uVar11 < 10000) goto LAB_00139d80;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar4 = cVar14 + '\x04';
            } while (bVar2);
            cVar14 = cVar14 + '\x01';
          }
LAB_00139d80:
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_388,cVar14);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_388._M_dataplus._M_p,(uint)local_388._M_string_length,uVar17);
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            uVar15 = local_3c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != &local_388.field_2) {
              uVar15 = local_388.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length)
            goto LAB_00139e17;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_388,0,(char *)0x0,(ulong)local_3c8._M_dataplus._M_p);
          }
          else {
LAB_00139e17:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_3c8,(ulong)local_388._M_dataplus._M_p);
          }
          local_3e8 = &local_3d8;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_3d8 = *puVar9;
            lStack_3d0 = puVar6[3];
          }
          else {
            local_3d8 = *puVar9;
            local_3e8 = (ulong *)*puVar6;
          }
          local_3e0 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)puVar9 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_3e8);
          local_430 = &local_420;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar8) {
            local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_420._8_8_ = plVar5[3];
          }
          else {
            local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar5;
          }
          local_428 = plVar5[1];
          *plVar5 = (long)paVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          cVar14 = '\x01';
          if (9 < uVar17) {
            uVar11 = uVar17;
            cVar4 = '\x04';
            do {
              cVar14 = cVar4;
              if (uVar11 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0013a3ef;
              }
              if (uVar11 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0013a3ef;
              }
              if (uVar11 < 10000) goto LAB_0013a3ef;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar4 = cVar14 + '\x04';
            } while (bVar2);
            cVar14 = cVar14 + '\x01';
          }
LAB_0013a3ef:
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_368,cVar14);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_368._M_dataplus._M_p,(uint)local_368._M_string_length,uVar17);
          uVar15 = 0xf;
          if (local_430 != &local_420) {
            uVar15 = local_420._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_368._M_string_length + local_428) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_dataplus._M_p != &local_368.field_2) {
              uVar15 = local_368.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_368._M_string_length + local_428) goto LAB_0013a475;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_430)
            ;
          }
          else {
LAB_0013a475:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_430,(ulong)local_368._M_dataplus._M_p);
          }
          local_450 = &local_440;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_440 = *puVar9;
            lStack_438 = puVar6[3];
          }
          else {
            local_440 = *puVar9;
            local_450 = (ulong *)*puVar6;
          }
          local_448 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_400 = *puVar9;
            lStack_3f8 = puVar6[3];
            local_410 = &local_400;
          }
          else {
            local_400 = *puVar9;
            local_410 = (ulong *)*puVar6;
          }
          local_408 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::string::_M_append(local_2b8,(ulong)local_410);
          if (local_410 != &local_400) {
            operator_delete(local_410);
          }
          if (local_450 != &local_440) {
            operator_delete(local_450);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          if (local_430 != &local_420) {
            operator_delete(local_430);
          }
          if (local_3e8 != &local_3d8) {
            operator_delete(local_3e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p);
          }
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_3a8,'\x06');
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a8);
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          puVar9 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_3c8.field_2._M_allocated_capacity = *puVar9;
            local_3c8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_3c8.field_2._M_allocated_capacity = *puVar9;
            local_3c8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_3c8._M_string_length = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          cVar14 = '\x01';
          if (9 < uVar17) {
            uVar11 = uVar17;
            cVar4 = '\x04';
            do {
              cVar14 = cVar4;
              if (uVar11 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0013a6db;
              }
              if (uVar11 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0013a6db;
              }
              if (uVar11 < 10000) goto LAB_0013a6db;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar4 = cVar14 + '\x04';
            } while (bVar2);
            cVar14 = cVar14 + '\x01';
          }
LAB_0013a6db:
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_388,cVar14);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_388._M_dataplus._M_p,(uint)local_388._M_string_length,uVar17);
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            uVar15 = local_3c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != &local_388.field_2) {
              uVar15 = local_388.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length)
            goto LAB_0013a772;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_388,0,(char *)0x0,(ulong)local_3c8._M_dataplus._M_p);
          }
          else {
LAB_0013a772:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_3c8,(ulong)local_388._M_dataplus._M_p);
          }
          local_3e8 = &local_3d8;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_3d8 = *puVar9;
            lStack_3d0 = puVar6[3];
          }
          else {
            local_3d8 = *puVar9;
            local_3e8 = (ulong *)*puVar6;
          }
          local_3e0 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
          local_430 = &local_420;
          psVar10 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_420._M_allocated_capacity = *psVar10;
            local_420._8_8_ = puVar6[3];
          }
          else {
            local_420._M_allocated_capacity = *psVar10;
            local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar6;
          }
          local_428 = puVar6[1];
          *puVar6 = psVar10;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          cVar14 = '\x01';
          if (9 < uVar17) {
            uVar11 = uVar17;
            cVar4 = '\x04';
            do {
              cVar14 = cVar4;
              if (uVar11 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0013aa84;
              }
              if (uVar11 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0013aa84;
              }
              if (uVar11 < 10000) goto LAB_0013aa84;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar4 = cVar14 + '\x04';
            } while (bVar2);
            cVar14 = cVar14 + '\x01';
          }
LAB_0013aa84:
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_368,cVar14);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_368._M_dataplus._M_p,(uint)local_368._M_string_length,uVar17);
          uVar15 = 0xf;
          if (local_430 != &local_420) {
            uVar15 = local_420._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_368._M_string_length + local_428) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_dataplus._M_p != &local_368.field_2) {
              uVar15 = local_368.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_368._M_string_length + local_428) goto LAB_0013ab0a;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_430)
            ;
          }
          else {
LAB_0013ab0a:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_430,(ulong)local_368._M_dataplus._M_p);
          }
          local_450 = &local_440;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_440 = *puVar9;
            lStack_438 = puVar6[3];
          }
          else {
            local_440 = *puVar9;
            local_450 = (ulong *)*puVar6;
          }
          local_448 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_400 = *puVar9;
            lStack_3f8 = puVar6[3];
            local_410 = &local_400;
          }
          else {
            local_400 = *puVar9;
            local_410 = (ulong *)*puVar6;
          }
          local_408 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_410);
          if (local_410 != &local_400) {
            operator_delete(local_410);
          }
          if (local_450 != &local_440) {
            operator_delete(local_450);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          if (local_430 != &local_420) {
            operator_delete(local_430);
          }
          if (local_3e8 != &local_3d8) {
            operator_delete(local_3e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p);
          }
          local_298 = 6;
        }
        else {
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_368,'\x06');
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_368);
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
          puVar9 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_388.field_2._M_allocated_capacity = *puVar9;
            local_388.field_2._8_8_ = plVar5[3];
          }
          else {
            local_388.field_2._M_allocated_capacity = *puVar9;
            local_388._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_388._M_string_length = plVar5[1];
          *plVar5 = (long)puVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          cVar14 = '\x01';
          if (9 < uVar17) {
            uVar11 = uVar17;
            cVar4 = '\x04';
            do {
              cVar14 = cVar4;
              if (uVar11 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_00139ba5;
              }
              if (uVar11 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_00139ba5;
              }
              if (uVar11 < 10000) goto LAB_00139ba5;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar4 = cVar14 + '\x04';
            } while (bVar2);
            cVar14 = cVar14 + '\x01';
          }
LAB_00139ba5:
          local_340 = &local_330;
          std::__cxx11::string::_M_construct((ulong)&local_340,cVar14);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_340,(uint)local_338,uVar17)
          ;
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            uVar15 = local_388.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_338 + local_388._M_string_length) {
            uVar11 = 0xf;
            if (local_340 != &local_330) {
              uVar11 = local_330;
            }
            if (uVar11 < local_338 + local_388._M_string_length) goto LAB_00139c2c;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_340,0,(char *)0x0,(ulong)local_388._M_dataplus._M_p);
          }
          else {
LAB_00139c2c:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_340);
          }
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          psVar10 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_3a8.field_2._M_allocated_capacity = *psVar10;
            local_3a8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_3a8.field_2._M_allocated_capacity = *psVar10;
            local_3a8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_3a8._M_string_length = puVar6[1];
          *puVar6 = psVar10;
          puVar6[1] = 0;
          *(undefined1 *)psVar10 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_3a8);
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          puVar9 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_3c8.field_2._M_allocated_capacity = *puVar9;
            local_3c8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_3c8.field_2._M_allocated_capacity = *puVar9;
            local_3c8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_3c8._M_string_length = plVar5[1];
          *plVar5 = (long)puVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          cVar14 = '\x01';
          if (9 < uVar17) {
            uVar11 = uVar17;
            cVar4 = '\x04';
            do {
              cVar14 = cVar4;
              if (uVar11 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_00139f4e;
              }
              if (uVar11 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_00139f4e;
              }
              if (uVar11 < 10000) goto LAB_00139f4e;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar4 = cVar14 + '\x04';
            } while (bVar2);
            cVar14 = cVar14 + '\x01';
          }
LAB_00139f4e:
          local_2f8 = &local_2e8;
          std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar14);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f8,(uint)local_2f0,uVar17)
          ;
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            uVar15 = local_3c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_2f0 + local_3c8._M_string_length) {
            uVar11 = 0xf;
            if (local_2f8 != &local_2e8) {
              uVar11 = local_2e8;
            }
            if (uVar11 < local_2f0 + local_3c8._M_string_length) goto LAB_00139fe5;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_3c8._M_dataplus._M_p);
          }
          else {
LAB_00139fe5:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_2f8);
          }
          local_3e8 = &local_3d8;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_3d8 = *puVar9;
            lStack_3d0 = puVar6[3];
          }
          else {
            local_3d8 = *puVar9;
            local_3e8 = (ulong *)*puVar6;
          }
          local_3e0 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)puVar9 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_3e8);
          local_430 = &local_420;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar8) {
            local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_420._8_8_ = plVar5[3];
          }
          else {
            local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar5;
          }
          local_428 = plVar5[1];
          *plVar5 = (long)paVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          local_320 = &local_310;
          std::__cxx11::string::_M_construct((ulong)&local_320,'\x06');
          uVar15 = 0xf;
          if (local_430 != &local_420) {
            uVar15 = local_420._M_allocated_capacity;
          }
          if ((ulong)uVar15 < (ulong)(local_318 + local_428)) {
            uVar11 = 0xf;
            if (local_320 != &local_310) {
              uVar11 = local_310;
            }
            if (uVar11 < (ulong)(local_318 + local_428)) goto LAB_0013a12c;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,(ulong)local_430)
            ;
          }
          else {
LAB_0013a12c:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_320);
          }
          local_450 = &local_440;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_440 = *puVar9;
            lStack_438 = puVar6[3];
          }
          else {
            local_440 = *puVar9;
            local_450 = (ulong *)*puVar6;
          }
          local_448 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_400 = *puVar9;
            lStack_3f8 = puVar6[3];
            local_410 = &local_400;
          }
          else {
            local_400 = *puVar9;
            local_410 = (ulong *)*puVar6;
          }
          local_408 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::string::_M_append(local_2b8,(ulong)local_410);
          if (local_410 != &local_400) {
            operator_delete(local_410);
          }
          if (local_450 != &local_440) {
            operator_delete(local_450);
          }
          if (local_320 != &local_310) {
            operator_delete(local_320);
          }
          if (local_430 != &local_420) {
            operator_delete(local_430);
          }
          if (local_3e8 != &local_3d8) {
            operator_delete(local_3e8);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p);
          }
          if (local_340 != &local_330) {
            operator_delete(local_340);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_368,'\x06');
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_368);
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
          puVar9 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_388.field_2._M_allocated_capacity = *puVar9;
            local_388.field_2._8_8_ = plVar5[3];
          }
          else {
            local_388.field_2._M_allocated_capacity = *puVar9;
            local_388._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_388._M_string_length = plVar5[1];
          *plVar5 = (long)puVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          cVar14 = '\x01';
          if (9 < uVar17) {
            uVar11 = uVar17;
            cVar4 = '\x04';
            do {
              cVar14 = cVar4;
              if (uVar11 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0013a8a9;
              }
              if (uVar11 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0013a8a9;
              }
              if (uVar11 < 10000) goto LAB_0013a8a9;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar4 = cVar14 + '\x04';
            } while (bVar2);
            cVar14 = cVar14 + '\x01';
          }
LAB_0013a8a9:
          local_340 = &local_330;
          std::__cxx11::string::_M_construct((ulong)&local_340,cVar14);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_340,(uint)local_338,uVar17)
          ;
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            uVar15 = local_388.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_338 + local_388._M_string_length) {
            uVar11 = 0xf;
            if (local_340 != &local_330) {
              uVar11 = local_330;
            }
            if (uVar11 < local_338 + local_388._M_string_length) goto LAB_0013a930;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_340,0,(char *)0x0,(ulong)local_388._M_dataplus._M_p);
          }
          else {
LAB_0013a930:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_340);
          }
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          puVar9 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_3a8.field_2._M_allocated_capacity = *puVar9;
            local_3a8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_3a8.field_2._M_allocated_capacity = *puVar9;
            local_3a8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_3a8._M_string_length = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a8);
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          puVar9 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_3c8.field_2._M_allocated_capacity = *puVar9;
            local_3c8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_3c8.field_2._M_allocated_capacity = *puVar9;
            local_3c8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_3c8._M_string_length = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          cVar14 = '\x01';
          if (9 < uVar17) {
            uVar11 = uVar17;
            cVar4 = '\x04';
            do {
              cVar14 = cVar4;
              if (uVar11 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0013aca4;
              }
              if (uVar11 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0013aca4;
              }
              if (uVar11 < 10000) goto LAB_0013aca4;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              cVar4 = cVar14 + '\x04';
            } while (bVar2);
            cVar14 = cVar14 + '\x01';
          }
LAB_0013aca4:
          local_2f8 = &local_2e8;
          std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar14);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f8,(uint)local_2f0,uVar17)
          ;
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            uVar15 = local_3c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_2f0 + local_3c8._M_string_length) {
            uVar17 = 0xf;
            if (local_2f8 != &local_2e8) {
              uVar17 = local_2e8;
            }
            if (uVar17 < local_2f0 + local_3c8._M_string_length) goto LAB_0013ad3b;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_3c8._M_dataplus._M_p);
          }
          else {
LAB_0013ad3b:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_2f8);
          }
          local_3e8 = &local_3d8;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_3d8 = *puVar9;
            lStack_3d0 = puVar6[3];
          }
          else {
            local_3d8 = *puVar9;
            local_3e8 = (ulong *)*puVar6;
          }
          local_3e0 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
          local_430 = &local_420;
          psVar10 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_420._M_allocated_capacity = *psVar10;
            local_420._8_8_ = puVar6[3];
          }
          else {
            local_420._M_allocated_capacity = *psVar10;
            local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar6;
          }
          local_428 = puVar6[1];
          *puVar6 = psVar10;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          local_320 = &local_310;
          std::__cxx11::string::_M_construct((ulong)&local_320,'\x06');
          uVar15 = 0xf;
          if (local_430 != &local_420) {
            uVar15 = local_420._M_allocated_capacity;
          }
          if ((ulong)uVar15 < (ulong)(local_318 + local_428)) {
            uVar17 = 0xf;
            if (local_320 != &local_310) {
              uVar17 = local_310;
            }
            if (uVar17 < (ulong)(local_318 + local_428)) goto LAB_0013ae82;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,(ulong)local_430)
            ;
          }
          else {
LAB_0013ae82:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_320);
          }
          local_450 = &local_440;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_440 = *puVar9;
            lStack_438 = puVar6[3];
          }
          else {
            local_440 = *puVar9;
            local_450 = (ulong *)*puVar6;
          }
          local_448 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_400 = *puVar9;
            lStack_3f8 = puVar6[3];
            local_410 = &local_400;
          }
          else {
            local_400 = *puVar9;
            local_410 = (ulong *)*puVar6;
          }
          local_408 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_410);
          if (local_410 != &local_400) {
            operator_delete(local_410);
          }
          if (local_450 != &local_440) {
            operator_delete(local_450);
          }
          if (local_320 != &local_310) {
            operator_delete(local_320);
          }
          if (local_430 != &local_420) {
            operator_delete(local_430);
          }
          if (local_3e8 != &local_3d8) {
            operator_delete(local_3e8);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p);
          }
          if (local_340 != &local_330) {
            operator_delete(local_340);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
        }
      }
      pAVar21 = (&((local_100.
                    super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
                  super__Vector_impl_data._M_start)[local_288];
      local_58 = (&((local_100.
                     super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
                   super__Vector_impl_data._M_finish)[local_288];
      if (pAVar21 != local_58) {
        do {
          ppVar18 = (pAVar21->incVars).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pAVar21->incVars).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl + 8) != ppVar18) {
            local_300 = 1000;
            uVar17 = 0;
            sVar20 = 1000;
            do {
              if (ppVar18[uVar17].first != local_3f0->labelID) {
                ppVar19 = ppVar18 + uVar17;
                if (ppVar18[uVar17].first != local_300 || ppVar19->second != sVar20) {
                  local_450 = &local_440;
                  std::__cxx11::string::_M_construct((ulong)&local_450,(char)local_298);
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                  local_410 = &local_400;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_400 = *puVar9;
                    lStack_3f8 = puVar6[3];
                  }
                  else {
                    local_400 = *puVar9;
                    local_410 = (ulong *)*puVar6;
                  }
                  local_408 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_410);
                  if (local_410 != &local_400) {
                    operator_delete(local_410);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                }
                if ((ppVar19->first == ppVar19->second) &&
                   (ppVar19->first != local_300 || ppVar19->second != sVar20)) {
                  std::__cxx11::string::append((char *)&local_2d8);
                }
                if (((local_3f0->_categoricalFeatures).super__Base_bitset<2UL>._M_w
                     [ppVar19->first >> 6] >> (ppVar19->first & 0x3f) & 1) == 0) {
                  local_3e8 = &local_3d8;
                  std::__cxx11::string::_M_construct((ulong)&local_3e8,(char)local_298);
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
                  local_430 = &local_420;
                  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(puVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 == paVar8) {
                    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_420._8_8_ = puVar6[3];
                  }
                  else {
                    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar6;
                  }
                  local_428 = puVar6[1];
                  *puVar6 = paVar8;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  uVar11 = (local_3f0->_parameterIndex).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[ppVar19->first];
                  cVar14 = '\x01';
                  if (9 < uVar11) {
                    uVar12 = uVar11;
                    cVar4 = '\x04';
                    do {
                      cVar14 = cVar4;
                      if (uVar12 < 100) {
                        cVar14 = cVar14 + -2;
                        goto LAB_0013b970;
                      }
                      if (uVar12 < 1000) {
                        cVar14 = cVar14 + -1;
                        goto LAB_0013b970;
                      }
                      if (uVar12 < 10000) goto LAB_0013b970;
                      bVar2 = 99999 < uVar12;
                      uVar12 = uVar12 / 10000;
                      cVar4 = cVar14 + '\x04';
                    } while (bVar2);
                    cVar14 = cVar14 + '\x01';
                  }
LAB_0013b970:
                  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_3c8,cVar14);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            (local_3c8._M_dataplus._M_p,(uint)local_3c8._M_string_length,uVar11);
                  uVar15 = 0xf;
                  if (local_430 != &local_420) {
                    uVar15 = local_420._M_allocated_capacity;
                  }
                  if ((ulong)uVar15 < local_3c8._M_string_length + local_428) {
                    uVar15 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                      uVar15 = local_3c8.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar15 < local_3c8._M_string_length + local_428) goto LAB_0013b9fb;
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_3c8,0,(char *)0x0,(ulong)local_430);
                  }
                  else {
LAB_0013b9fb:
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_430,(ulong)local_3c8._M_dataplus._M_p);
                  }
                  local_450 = &local_440;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_440 = *puVar9;
                    lStack_438 = puVar6[3];
                  }
                  else {
                    local_440 = *puVar9;
                    local_450 = (ulong *)*puVar6;
                  }
                  local_448 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)puVar9 = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                  local_410 = &local_400;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_400 = *puVar9;
                    lStack_3f8 = puVar6[3];
                  }
                  else {
                    local_400 = *puVar9;
                    local_410 = (ulong *)*puVar6;
                  }
                  local_408 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  std::__cxx11::string::_M_append(local_2b8,(ulong)local_410);
                  if (local_410 != &local_400) {
                    operator_delete(local_410);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                    operator_delete(local_3c8._M_dataplus._M_p);
                  }
                  if (local_430 != &local_420) {
                    operator_delete(local_430);
                  }
                  if (local_3e8 != &local_3d8) {
                    operator_delete(local_3e8);
                  }
                  if ((sVar20 != ppVar19->second) || (local_300 != ppVar19->first)) {
                    uVar11 = (local_3f0->_parameterIndex).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[ppVar19->first];
                    cVar14 = '\x01';
                    if (9 < uVar11) {
                      uVar12 = uVar11;
                      cVar4 = '\x04';
                      do {
                        cVar14 = cVar4;
                        if (uVar12 < 100) {
                          cVar14 = cVar14 + -2;
                          goto LAB_0013bbc1;
                        }
                        if (uVar12 < 1000) {
                          cVar14 = cVar14 + -1;
                          goto LAB_0013bbc1;
                        }
                        if (uVar12 < 10000) goto LAB_0013bbc1;
                        bVar2 = 99999 < uVar12;
                        uVar12 = uVar12 / 10000;
                        cVar4 = cVar14 + '\x04';
                      } while (bVar2);
                      cVar14 = cVar14 + '\x01';
                    }
LAB_0013bbc1:
                    local_430 = &local_420;
                    std::__cxx11::string::_M_construct((ulong)&local_430,cVar14);
                    std::__detail::__to_chars_10_impl<unsigned_long>
                              (local_430->_M_local_buf,(uint)local_428,uVar11);
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,0x2a56af)
                    ;
                    local_450 = &local_440;
                    puVar9 = puVar6 + 2;
                    if ((ulong *)*puVar6 == puVar9) {
                      local_440 = *puVar9;
                      lStack_438 = puVar6[3];
                    }
                    else {
                      local_440 = *puVar9;
                      local_450 = (ulong *)*puVar6;
                    }
                    local_448 = puVar6[1];
                    *puVar6 = puVar9;
                    puVar6[1] = 0;
                    *(undefined1 *)(puVar6 + 2) = 0;
                    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                    local_410 = &local_400;
                    puVar9 = puVar6 + 2;
                    if ((ulong *)*puVar6 == puVar9) {
                      local_400 = *puVar9;
                      lStack_3f8 = puVar6[3];
                    }
                    else {
                      local_400 = *puVar9;
                      local_410 = (ulong *)*puVar6;
                    }
                    local_408 = puVar6[1];
                    *puVar6 = puVar9;
                    puVar6[1] = 0;
                    *(undefined1 *)(puVar6 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_410);
                    if (local_410 != &local_400) {
                      operator_delete(local_410);
                    }
                    if (local_450 != &local_440) {
                      operator_delete(local_450);
                    }
                    _Var16._M_p = (pointer)local_430;
                    if (local_430 != &local_420) goto LAB_0013bcf1;
                  }
                }
                else {
                  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_3a8,(char)local_298);
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a8);
                  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
                  puVar9 = puVar6 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar9) {
                    local_3c8.field_2._M_allocated_capacity = *puVar9;
                    local_3c8.field_2._8_8_ = puVar6[3];
                  }
                  else {
                    local_3c8.field_2._M_allocated_capacity = *puVar9;
                    local_3c8._M_dataplus._M_p = (pointer)*puVar6;
                  }
                  local_3c8._M_string_length = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  getAttributeName_abi_cxx11_(&local_388,local_3f0,ppVar19->first);
                  uVar15 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                    uVar15 = local_3c8.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length) {
                    uVar15 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_388._M_dataplus._M_p != &local_388.field_2) {
                      uVar15 = local_388.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length)
                    goto LAB_0013b34c;
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_388,0,(char *)0x0,
                                        (ulong)local_3c8._M_dataplus._M_p);
                  }
                  else {
LAB_0013b34c:
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_3c8,(ulong)local_388._M_dataplus._M_p);
                  }
                  local_3e8 = &local_3d8;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_3d8 = *puVar9;
                    lStack_3d0 = puVar6[3];
                  }
                  else {
                    local_3d8 = *puVar9;
                    local_3e8 = (ulong *)*puVar6;
                  }
                  local_3e0 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)puVar9 = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
                  local_430 = &local_420;
                  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(puVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 == paVar8) {
                    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_420._8_8_ = puVar6[3];
                  }
                  else {
                    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar6;
                  }
                  local_428 = puVar6[1];
                  *puVar6 = paVar8;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  getAttributeName_abi_cxx11_(&local_368,local_3f0,ppVar19->first);
                  uVar15 = 0xf;
                  if (local_430 != &local_420) {
                    uVar15 = local_420._M_allocated_capacity;
                  }
                  if ((ulong)uVar15 < local_368._M_string_length + local_428) {
                    uVar15 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_368._M_dataplus._M_p != &local_368.field_2) {
                      uVar15 = local_368.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar15 < local_368._M_string_length + local_428) goto LAB_0013b482;
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_368,0,(char *)0x0,(ulong)local_430);
                  }
                  else {
LAB_0013b482:
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_430,(ulong)local_368._M_dataplus._M_p);
                  }
                  local_450 = &local_440;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_440 = *puVar9;
                    lStack_438 = puVar6[3];
                  }
                  else {
                    local_440 = *puVar9;
                    local_450 = (ulong *)*puVar6;
                  }
                  local_448 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)puVar9 = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_450);
                  local_410 = &local_400;
                  puVar9 = (ulong *)(plVar5 + 2);
                  if ((ulong *)*plVar5 == puVar9) {
                    local_400 = *puVar9;
                    lStack_3f8 = plVar5[3];
                  }
                  else {
                    local_400 = *puVar9;
                    local_410 = (ulong *)*plVar5;
                  }
                  local_408 = plVar5[1];
                  *plVar5 = (long)puVar9;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  std::__cxx11::string::_M_append(local_2b8,(ulong)local_410);
                  if (local_410 != &local_400) {
                    operator_delete(local_410);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_368._M_dataplus._M_p != &local_368.field_2) {
                    operator_delete(local_368._M_dataplus._M_p);
                  }
                  if (local_430 != &local_420) {
                    operator_delete(local_430);
                  }
                  if (local_3e8 != &local_3d8) {
                    operator_delete(local_3e8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_388._M_dataplus._M_p != &local_388.field_2) {
                    operator_delete(local_388._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                    operator_delete(local_3c8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                    operator_delete(local_3a8._M_dataplus._M_p);
                  }
                  if ((sVar20 == ppVar19->second) && (local_300 == ppVar19->first))
                  goto LAB_0013bcf6;
                  getAttributeName_abi_cxx11_(&local_3c8,local_3f0,ppVar19->first);
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_3c8,0,(char *)0x0,0x2a5571);
                  local_3e8 = &local_3d8;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_3d8 = *puVar9;
                    lStack_3d0 = puVar6[3];
                  }
                  else {
                    local_3d8 = *puVar9;
                    local_3e8 = (ulong *)*puVar6;
                  }
                  local_3e0 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
                  local_430 = &local_420;
                  psVar10 = puVar6 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar10) {
                    local_420._M_allocated_capacity = *psVar10;
                    local_420._8_8_ = puVar6[3];
                  }
                  else {
                    local_420._M_allocated_capacity = *psVar10;
                    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar6;
                  }
                  local_428 = puVar6[1];
                  *puVar6 = psVar10;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  getAttributeName_abi_cxx11_(&local_3a8,local_3f0,ppVar19->first);
                  uVar15 = 0xf;
                  if (local_430 != &local_420) {
                    uVar15 = local_420._M_allocated_capacity;
                  }
                  if ((ulong)uVar15 < local_3a8._M_string_length + local_428) {
                    uVar15 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                      uVar15 = local_3a8.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar15 < local_3a8._M_string_length + local_428) goto LAB_0013b810;
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_3a8,0,(char *)0x0,(ulong)local_430);
                  }
                  else {
LAB_0013b810:
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_430,(ulong)local_3a8._M_dataplus._M_p);
                  }
                  local_450 = &local_440;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_440 = *puVar9;
                    lStack_438 = puVar6[3];
                  }
                  else {
                    local_440 = *puVar9;
                    local_450 = (ulong *)*puVar6;
                  }
                  local_448 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)puVar9 = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                  local_410 = &local_400;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_400 = *puVar9;
                    lStack_3f8 = puVar6[3];
                  }
                  else {
                    local_400 = *puVar9;
                    local_410 = (ulong *)*puVar6;
                  }
                  local_408 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_410);
                  if (local_410 != &local_400) {
                    operator_delete(local_410);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                    operator_delete(local_3a8._M_dataplus._M_p);
                  }
                  if (local_430 != &local_420) {
                    operator_delete(local_430);
                  }
                  if (local_3e8 != &local_3d8) {
                    operator_delete(local_3e8);
                  }
                  _Var16._M_p = local_3c8._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
LAB_0013bcf1:
                    operator_delete(_Var16._M_p);
                  }
                }
LAB_0013bcf6:
                uVar11 = pAVar21->aggNum;
                cVar14 = '\x01';
                if (9 < uVar11) {
                  uVar12 = uVar11;
                  cVar4 = '\x04';
                  do {
                    cVar14 = cVar4;
                    if (uVar12 < 100) {
                      cVar14 = cVar14 + -2;
                      goto LAB_0013bd53;
                    }
                    if (uVar12 < 1000) {
                      cVar14 = cVar14 + -1;
                      goto LAB_0013bd53;
                    }
                    if (uVar12 < 10000) goto LAB_0013bd53;
                    bVar2 = 99999 < uVar12;
                    uVar12 = uVar12 / 10000;
                    cVar4 = cVar14 + '\x04';
                  } while (bVar2);
                  cVar14 = cVar14 + '\x01';
                }
LAB_0013bd53:
                local_430 = &local_420;
                std::__cxx11::string::_M_construct((ulong)&local_430,cVar14);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          (local_430->_M_local_buf,(uint)local_428,uVar11);
                plVar5 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_430,0,(char *)0x0,0x2b4937);
                local_450 = &local_440;
                puVar9 = (ulong *)(plVar5 + 2);
                if ((ulong *)*plVar5 == puVar9) {
                  local_440 = *puVar9;
                  lStack_438 = plVar5[3];
                }
                else {
                  local_440 = *puVar9;
                  local_450 = (ulong *)*plVar5;
                }
                local_448 = plVar5[1];
                *plVar5 = (long)puVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_450);
                local_410 = &local_400;
                puVar9 = (ulong *)(plVar5 + 2);
                if ((ulong *)*plVar5 == puVar9) {
                  local_400 = *puVar9;
                  lStack_3f8 = plVar5[3];
                }
                else {
                  local_400 = *puVar9;
                  local_410 = (ulong *)*plVar5;
                }
                local_408 = plVar5[1];
                *plVar5 = (long)puVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::_M_append(local_2b8,(ulong)local_410);
                if (local_410 != &local_400) {
                  operator_delete(local_410);
                }
                if (local_450 != &local_440) {
                  operator_delete(local_450);
                }
                if (local_430 != &local_420) {
                  operator_delete(local_430);
                }
                if ((sVar20 != ppVar19->second) || (local_300 != ppVar19->first)) {
                  uVar11 = pAVar21->aggNum;
                  cVar14 = '\x01';
                  if (9 < uVar11) {
                    uVar12 = uVar11;
                    cVar4 = '\x04';
                    do {
                      cVar14 = cVar4;
                      if (uVar12 < 100) {
                        cVar14 = cVar14 + -2;
                        goto LAB_0013bf05;
                      }
                      if (uVar12 < 1000) {
                        cVar14 = cVar14 + -1;
                        goto LAB_0013bf05;
                      }
                      if (uVar12 < 10000) goto LAB_0013bf05;
                      bVar2 = 99999 < uVar12;
                      uVar12 = uVar12 / 10000;
                      cVar4 = cVar14 + '\x04';
                    } while (bVar2);
                    cVar14 = cVar14 + '\x01';
                  }
LAB_0013bf05:
                  local_430 = &local_420;
                  std::__cxx11::string::_M_construct((ulong)&local_430,cVar14);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            (local_430->_M_local_buf,(uint)local_428,uVar11);
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,0x2b4937);
                  local_450 = &local_440;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_440 = *puVar9;
                    lStack_438 = puVar6[3];
                  }
                  else {
                    local_440 = *puVar9;
                    local_450 = (ulong *)*puVar6;
                  }
                  local_448 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                  local_410 = &local_400;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_400 = *puVar9;
                    lStack_3f8 = puVar6[3];
                  }
                  else {
                    local_400 = *puVar9;
                    local_410 = (ulong *)*puVar6;
                  }
                  local_408 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_410);
                  if (local_410 != &local_400) {
                    operator_delete(local_410);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                  if (local_430 != &local_420) {
                    operator_delete(local_430);
                  }
                }
                if (((local_3f0->_categoricalFeatures).super__Base_bitset<2UL>._M_w
                     [ppVar19->second >> 6] >> (ppVar19->second & 0x3f) & 1) == 0) {
                  uVar11 = (local_3f0->_parameterIndex).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[ppVar19->second];
                  cVar14 = '\x01';
                  if (9 < uVar11) {
                    uVar12 = uVar11;
                    cVar4 = '\x04';
                    do {
                      cVar14 = cVar4;
                      if (uVar12 < 100) {
                        cVar14 = cVar14 + -2;
                        goto LAB_0013c624;
                      }
                      if (uVar12 < 1000) {
                        cVar14 = cVar14 + -1;
                        goto LAB_0013c624;
                      }
                      if (uVar12 < 10000) goto LAB_0013c624;
                      bVar2 = 99999 < uVar12;
                      uVar12 = uVar12 / 10000;
                      cVar4 = cVar14 + '\x04';
                    } while (bVar2);
                    cVar14 = cVar14 + '\x01';
                  }
LAB_0013c624:
                  local_430 = &local_420;
                  std::__cxx11::string::_M_construct((ulong)&local_430,cVar14);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            (local_430->_M_local_buf,(uint)local_428,uVar11);
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,0x2a56af);
                  local_450 = &local_440;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_440 = *puVar9;
                    lStack_438 = puVar6[3];
                  }
                  else {
                    local_440 = *puVar9;
                    local_450 = (ulong *)*puVar6;
                  }
                  local_448 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                  local_410 = &local_400;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_400 = *puVar9;
                    lStack_3f8 = puVar6[3];
                  }
                  else {
                    local_400 = *puVar9;
                    local_410 = (ulong *)*puVar6;
                  }
                  local_408 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  std::__cxx11::string::_M_append(local_2b8,(ulong)local_410);
                  if (local_410 != &local_400) {
                    operator_delete(local_410);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                  if (local_430 != &local_420) {
                    operator_delete(local_430);
                  }
                  if ((sVar20 == ppVar19->second) && (local_300 == ppVar19->first))
                  goto LAB_0013c918;
                  uVar11 = (local_3f0->_parameterIndex).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[ppVar19->second];
                  cVar14 = '\x01';
                  if (9 < uVar11) {
                    uVar12 = uVar11;
                    cVar4 = '\x04';
                    do {
                      cVar14 = cVar4;
                      if (uVar12 < 100) {
                        cVar14 = cVar14 + -2;
                        goto LAB_0013c7ec;
                      }
                      if (uVar12 < 1000) {
                        cVar14 = cVar14 + -1;
                        goto LAB_0013c7ec;
                      }
                      if (uVar12 < 10000) goto LAB_0013c7ec;
                      bVar2 = 99999 < uVar12;
                      uVar12 = uVar12 / 10000;
                      cVar4 = cVar14 + '\x04';
                    } while (bVar2);
                    cVar14 = cVar14 + '\x01';
                  }
LAB_0013c7ec:
                  local_430 = &local_420;
                  std::__cxx11::string::_M_construct((ulong)&local_430,cVar14);
                  std::__detail::__to_chars_10_impl<unsigned_long>
                            (local_430->_M_local_buf,(uint)local_428,uVar11);
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,0x2a56af);
                  local_450 = &local_440;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_440 = *puVar9;
                    lStack_438 = puVar6[3];
                  }
                  else {
                    local_440 = *puVar9;
                    local_450 = (ulong *)*puVar6;
                  }
                  local_448 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_400 = *puVar9;
                    lStack_3f8 = puVar6[3];
                    local_410 = &local_400;
                  }
                  else {
                    local_400 = *puVar9;
                    local_410 = (ulong *)*puVar6;
                  }
                  local_408 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_410);
                  if (local_410 != &local_400) {
                    operator_delete(local_410);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                  paVar8 = &local_420;
                  _Var16._M_p = (pointer)local_430;
LAB_0013c90e:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var16._M_p != paVar8) {
                    operator_delete(_Var16._M_p);
                  }
                }
                else {
                  getAttributeName_abi_cxx11_(&local_3c8,local_3f0,ppVar19->second);
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_3c8,0,(char *)0x0,0x2a5571);
                  local_3e8 = &local_3d8;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_3d8 = *puVar9;
                    lStack_3d0 = puVar6[3];
                  }
                  else {
                    local_3d8 = *puVar9;
                    local_3e8 = (ulong *)*puVar6;
                  }
                  local_3e0 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
                  local_430 = &local_420;
                  psVar10 = puVar6 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar10) {
                    local_420._M_allocated_capacity = *psVar10;
                    local_420._8_8_ = puVar6[3];
                  }
                  else {
                    local_420._M_allocated_capacity = *psVar10;
                    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar6;
                  }
                  local_428 = puVar6[1];
                  *puVar6 = psVar10;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  getAttributeName_abi_cxx11_(&local_3a8,local_3f0,ppVar19->second);
                  uVar15 = 0xf;
                  if (local_430 != &local_420) {
                    uVar15 = local_420._M_allocated_capacity;
                  }
                  if ((ulong)uVar15 < local_3a8._M_string_length + local_428) {
                    uVar15 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                      uVar15 = local_3a8.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar15 < local_3a8._M_string_length + local_428) goto LAB_0013c20d;
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_3a8,0,(char *)0x0,(ulong)local_430);
                  }
                  else {
LAB_0013c20d:
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_430,(ulong)local_3a8._M_dataplus._M_p);
                  }
                  local_450 = &local_440;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_440 = *puVar9;
                    lStack_438 = puVar6[3];
                  }
                  else {
                    local_440 = *puVar9;
                    local_450 = (ulong *)*puVar6;
                  }
                  local_448 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)puVar9 = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                  local_410 = &local_400;
                  puVar9 = puVar6 + 2;
                  if ((ulong *)*puVar6 == puVar9) {
                    local_400 = *puVar9;
                    lStack_3f8 = puVar6[3];
                  }
                  else {
                    local_400 = *puVar9;
                    local_410 = (ulong *)*puVar6;
                  }
                  local_408 = puVar6[1];
                  *puVar6 = puVar9;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  std::__cxx11::string::_M_append(local_2b8,(ulong)local_410);
                  if (local_410 != &local_400) {
                    operator_delete(local_410);
                  }
                  if (local_450 != &local_440) {
                    operator_delete(local_450);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                    operator_delete(local_3a8._M_dataplus._M_p);
                  }
                  if (local_430 != &local_420) {
                    operator_delete(local_430);
                  }
                  if (local_3e8 != &local_3d8) {
                    operator_delete(local_3e8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                    operator_delete(local_3c8._M_dataplus._M_p);
                  }
                  this_00 = local_3f0;
                  if ((sVar20 != ppVar19->second) || (local_300 != ppVar19->first)) {
                    getAttributeName_abi_cxx11_(&local_3c8,local_3f0,ppVar19->second);
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace((ulong)&local_3c8,0,(char *)0x0,0x2a5571)
                    ;
                    local_3e8 = &local_3d8;
                    puVar9 = puVar6 + 2;
                    if ((ulong *)*puVar6 == puVar9) {
                      local_3d8 = *puVar9;
                      lStack_3d0 = puVar6[3];
                    }
                    else {
                      local_3d8 = *puVar9;
                      local_3e8 = (ulong *)*puVar6;
                    }
                    local_3e0 = puVar6[1];
                    *puVar6 = puVar9;
                    puVar6[1] = 0;
                    *(undefined1 *)(puVar6 + 2) = 0;
                    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
                    local_430 = &local_420;
                    psVar10 = puVar6 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar6 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar10) {
                      local_420._M_allocated_capacity = *psVar10;
                      local_420._8_8_ = puVar6[3];
                    }
                    else {
                      local_420._M_allocated_capacity = *psVar10;
                      local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)*puVar6;
                    }
                    local_428 = puVar6[1];
                    *puVar6 = psVar10;
                    puVar6[1] = 0;
                    *(undefined1 *)(puVar6 + 2) = 0;
                    getAttributeName_abi_cxx11_(&local_3a8,this_00,ppVar19->second);
                    uVar15 = 0xf;
                    if (local_430 != &local_420) {
                      uVar15 = local_420._M_allocated_capacity;
                    }
                    if ((ulong)uVar15 < local_3a8._M_string_length + local_428) {
                      uVar15 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                        uVar15 = local_3a8.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar15 < local_3a8._M_string_length + local_428) goto LAB_0013c4ce;
                      puVar6 = (undefined8 *)
                               std::__cxx11::string::replace
                                         ((ulong)&local_3a8,0,(char *)0x0,(ulong)local_430);
                    }
                    else {
LAB_0013c4ce:
                      puVar6 = (undefined8 *)
                               std::__cxx11::string::_M_append
                                         ((char *)&local_430,(ulong)local_3a8._M_dataplus._M_p);
                    }
                    local_450 = &local_440;
                    puVar9 = puVar6 + 2;
                    if ((ulong *)*puVar6 == puVar9) {
                      local_440 = *puVar9;
                      lStack_438 = puVar6[3];
                    }
                    else {
                      local_440 = *puVar9;
                      local_450 = (ulong *)*puVar6;
                    }
                    local_448 = puVar6[1];
                    *puVar6 = puVar9;
                    puVar6[1] = 0;
                    *(undefined1 *)puVar9 = 0;
                    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
                    puVar9 = puVar6 + 2;
                    if ((ulong *)*puVar6 == puVar9) {
                      local_400 = *puVar9;
                      lStack_3f8 = puVar6[3];
                      local_410 = &local_400;
                    }
                    else {
                      local_400 = *puVar9;
                      local_410 = (ulong *)*puVar6;
                    }
                    local_408 = puVar6[1];
                    *puVar6 = puVar9;
                    puVar6[1] = 0;
                    *(undefined1 *)(puVar6 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_410);
                    if (local_410 != &local_400) {
                      operator_delete(local_410);
                    }
                    if (local_450 != &local_440) {
                      operator_delete(local_450);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                      operator_delete(local_3a8._M_dataplus._M_p);
                    }
                    if (local_430 != &local_420) {
                      operator_delete(local_430);
                    }
                    if (local_3e8 != &local_3d8) {
                      operator_delete(local_3e8);
                    }
                    paVar8 = &local_3c8.field_2;
                    _Var16._M_p = local_3c8._M_dataplus._M_p;
                    goto LAB_0013c90e;
                  }
                }
LAB_0013c918:
                sVar20 = ppVar19->first;
                local_300 = ppVar19->second;
              }
              uVar17 = uVar17 + 1;
              ppVar18 = (pAVar21->incVars).
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar17 < (ulong)((long)*(pointer *)
                                             ((long)&(pAVar21->incVars).
                                                                                                          
                                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                                  ._M_impl + 8) - (long)ppVar18 >> 4));
          }
          pAVar21 = pAVar21 + 1;
        } while (pAVar21 != local_58);
      }
      uVar17 = local_60;
      if ((local_341 &
          (&((local_100.
              super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
            super__Vector_impl_data._M_start)[local_288] !=
          (&((local_100.
              super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
            super__Vector_impl_data._M_finish)[local_288]) != 0) {
        local_450 = &local_440;
        std::__cxx11::string::_M_construct((ulong)&local_450,'\x06');
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
        puVar9 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar9) {
          local_400 = *puVar9;
          lStack_3f8 = puVar6[3];
          local_410 = &local_400;
        }
        else {
          local_400 = *puVar9;
          local_410 = (ulong *)*puVar6;
        }
        local_408 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append(local_2b8,(ulong)local_410);
        if (local_410 != &local_400) {
          operator_delete(local_410);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450);
        }
        local_450 = &local_440;
        std::__cxx11::string::_M_construct((ulong)&local_450,'\x06');
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
        puVar9 = puVar6 + 2;
        if ((ulong *)*puVar6 == puVar9) {
          local_400 = *puVar9;
          lStack_3f8 = puVar6[3];
          local_410 = &local_400;
        }
        else {
          local_400 = *puVar9;
          local_410 = (ulong *)*puVar6;
        }
        local_408 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_410);
        if (local_410 != &local_400) {
          operator_delete(local_410);
        }
        if (local_450 != &local_440) {
          operator_delete(local_450);
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_290);
  }
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3a8,'\x06');
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_3c8.field_2._M_allocated_capacity = *puVar9;
    local_3c8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_3c8.field_2._M_allocated_capacity = *puVar9;
    local_3c8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_3c8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_388,'\t');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    uVar15 = local_3c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      uVar15 = local_388.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_388._M_string_length + local_3c8._M_string_length) goto LAB_0013cc0b;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_388,0,(char *)0x0,(ulong)local_3c8._M_dataplus._M_p);
  }
  else {
LAB_0013cc0b:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_388._M_dataplus._M_p);
  }
  local_3e8 = &local_3d8;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_3d8 = *puVar9;
    lStack_3d0 = puVar6[3];
  }
  else {
    local_3d8 = *puVar9;
    local_3e8 = (ulong *)*puVar6;
  }
  local_3e0 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3e8);
  local_430 = &local_420;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar8) {
    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_420._8_8_ = plVar5[3];
  }
  else {
    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5;
  }
  local_428 = plVar5[1];
  *plVar5 = (long)paVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_368,'\x03');
  uVar15 = 0xf;
  if (local_430 != &local_420) {
    uVar15 = local_420._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_368._M_string_length + local_428) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      uVar15 = local_368.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_368._M_string_length + local_428) goto LAB_0013cd4d;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_430);
  }
  else {
LAB_0013cd4d:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_368._M_dataplus._M_p);
  }
  local_450 = &local_440;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_440 = *puVar9;
    lStack_438 = puVar6[3];
  }
  else {
    local_440 = *puVar9;
    local_450 = (ulong *)*puVar6;
  }
  local_448 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_450);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_400 = *puVar9;
    lStack_3f8 = plVar5[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *puVar9;
    local_410 = (ulong *)*plVar5;
  }
  local_408 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append(local_2b8,(ulong)local_410);
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  uVar17 = (local_3f0->_parameterIndex).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[local_3f0->labelID];
  cVar14 = '\x01';
  if (9 < uVar17) {
    uVar11 = uVar17;
    cVar4 = '\x04';
    do {
      cVar14 = cVar4;
      if (uVar11 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0013cf4b;
      }
      if (uVar11 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0013cf4b;
      }
      if (uVar11 < 10000) goto LAB_0013cf4b;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar4 = cVar14 + '\x04';
    } while (bVar2);
    cVar14 = cVar14 + '\x01';
  }
LAB_0013cf4b:
  local_410 = &local_400;
  std::__cxx11::string::_M_construct((ulong)&local_410,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_410,(uint)local_408,uVar17);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x06');
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_270 = *puVar9;
    lStack_268 = plVar5[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *puVar9;
    local_280 = (ulong *)*plVar5;
  }
  local_278 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x06');
  uVar17 = 0xf;
  if (local_280 != &local_270) {
    uVar17 = local_270;
  }
  if (uVar17 < (ulong)(local_1b8 + local_278)) {
    uVar17 = 0xf;
    if (local_1c0 != local_1b0) {
      uVar17 = local_1b0[0];
    }
    if (uVar17 < (ulong)(local_1b8 + local_278)) goto LAB_0013d070;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_280);
  }
  else {
LAB_0013d070:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1c0);
  }
  local_1a0 = &local_190;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_190 = *puVar1;
    uStack_188 = puVar6[3];
  }
  else {
    local_190 = *puVar1;
    local_1a0 = (undefined8 *)*puVar6;
  }
  local_198 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_250 = *puVar9;
    lStack_248 = plVar5[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *puVar9;
    local_260 = (ulong *)*plVar5;
  }
  local_258 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,'\x06');
  uVar17 = 0xf;
  if (local_260 != &local_250) {
    uVar17 = local_250;
  }
  if (uVar17 < (ulong)(local_1d8 + local_258)) {
    uVar17 = 0xf;
    if (local_1e0 != local_1d0) {
      uVar17 = local_1d0[0];
    }
    if (uVar17 < (ulong)(local_1d8 + local_258)) goto LAB_0013d1c3;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_260);
  }
  else {
LAB_0013d1c3:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_1e0);
  }
  local_180 = &local_170;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_170 = *puVar1;
    uStack_168 = puVar6[3];
  }
  else {
    local_170 = *puVar1;
    local_180 = (undefined8 *)*puVar6;
  }
  local_178 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_230 = *puVar9;
    lStack_228 = plVar5[3];
    local_240 = &local_230;
  }
  else {
    local_230 = *puVar9;
    local_240 = (ulong *)*plVar5;
  }
  local_238 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,'\x06');
  uVar17 = 0xf;
  if (local_240 != &local_230) {
    uVar17 = local_230;
  }
  if (uVar17 < (ulong)(local_1f8 + local_238)) {
    uVar17 = 0xf;
    if (local_200 != local_1f0) {
      uVar17 = local_1f0[0];
    }
    if (uVar17 < (ulong)(local_1f8 + local_238)) goto LAB_0013d316;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_240);
  }
  else {
LAB_0013d316:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_200);
  }
  local_160 = &local_150;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_150 = *puVar1;
    uStack_148 = puVar6[3];
  }
  else {
    local_150 = *puVar1;
    local_160 = (undefined8 *)*puVar6;
  }
  local_158 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_210 = *puVar9;
    lStack_208 = plVar5[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *puVar9;
    local_220 = (ulong *)*plVar5;
  }
  local_218 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,'\t');
  uVar17 = 0xf;
  if (local_220 != &local_210) {
    uVar17 = local_210;
  }
  if (uVar17 < (ulong)(local_80 + local_218)) {
    uVar17 = 0xf;
    if (local_88 != local_78) {
      uVar17 = local_78[0];
    }
    if (uVar17 < (ulong)(local_80 + local_218)) goto LAB_0013d46a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_220);
  }
  else {
LAB_0013d46a:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_88);
  }
  local_140 = &local_130;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_130 = *puVar1;
    uStack_128 = puVar6[3];
  }
  else {
    local_130 = *puVar1;
    local_140 = (undefined8 *)*puVar6;
  }
  local_138 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_110 = *puVar9;
    lStack_108 = plVar5[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *puVar9;
    local_120 = (ulong *)*plVar5;
  }
  local_118 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,'\x06');
  uVar17 = 0xf;
  if (local_120 != &local_110) {
    uVar17 = local_110;
  }
  if (uVar17 < (ulong)(local_a0 + local_118)) {
    uVar17 = 0xf;
    if (local_a8 != local_98) {
      uVar17 = local_98[0];
    }
    if (uVar17 < (ulong)(local_a0 + local_118)) goto LAB_0013d5bd;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_120);
  }
  else {
LAB_0013d5bd:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_a8);
  }
  local_320 = &local_310;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_310 = *puVar9;
    uStack_308 = puVar6[3];
  }
  else {
    local_310 = *puVar9;
    local_320 = (ulong *)*puVar6;
  }
  local_318 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_320);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_2e8 = *puVar9;
    lStack_2e0 = plVar5[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar9;
    local_2f8 = (ulong *)*plVar5;
  }
  local_2f0 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_410);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_330 = *puVar9;
    lStack_328 = plVar5[3];
    local_340 = &local_330;
  }
  else {
    local_330 = *puVar9;
    local_340 = (ulong *)*plVar5;
  }
  local_338 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_340);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_368.field_2._M_allocated_capacity = *psVar10;
    local_368.field_2._8_8_ = plVar5[3];
  }
  else {
    local_368.field_2._M_allocated_capacity = *psVar10;
    local_368._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_368._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_410);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_388.field_2._M_allocated_capacity = *psVar10;
    local_388.field_2._8_8_ = plVar5[3];
  }
  else {
    local_388.field_2._M_allocated_capacity = *psVar10;
    local_388._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_388._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_388);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_3a8.field_2._M_allocated_capacity = *puVar9;
    local_3a8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_3a8.field_2._M_allocated_capacity = *puVar9;
    local_3a8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_3a8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct((ulong)&local_c8,'\x06');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    uVar15 = local_3a8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_c0 + local_3a8._M_string_length) {
    uVar17 = 0xf;
    if (local_c8 != local_b8) {
      uVar17 = local_b8[0];
    }
    if (uVar17 < local_c0 + local_3a8._M_string_length) goto LAB_0013d8ac;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_c8,0,(char *)0x0,(ulong)local_3a8._M_dataplus._M_p);
  }
  else {
LAB_0013d8ac:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_c8);
  }
  psVar10 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_3c8.field_2._M_allocated_capacity = *psVar10;
    local_3c8.field_2._8_8_ = puVar6[3];
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  }
  else {
    local_3c8.field_2._M_allocated_capacity = *psVar10;
    local_3c8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_3c8._M_string_length = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3c8);
  local_3e8 = &local_3d8;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_3d8 = *puVar9;
    lStack_3d0 = plVar5[3];
  }
  else {
    local_3d8 = *puVar9;
    local_3e8 = (ulong *)*plVar5;
  }
  local_3e0 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,'\x03');
  uVar17 = 0xf;
  if (local_3e8 != &local_3d8) {
    uVar17 = local_3d8;
  }
  if (uVar17 < (ulong)(local_e0 + local_3e0)) {
    uVar17 = 0xf;
    if (local_e8 != local_d8) {
      uVar17 = local_d8[0];
    }
    if ((ulong)(local_e0 + local_3e0) <= uVar17) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_3e8);
      goto LAB_0013da1c;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_e8);
LAB_0013da1c:
  local_430 = &local_420;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar8) {
    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_420._8_8_ = puVar6[3];
  }
  else {
    local_420._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6;
  }
  local_428 = puVar6[1];
  *puVar6 = paVar8;
  puVar6[1] = 0;
  paVar8->_M_local_buf[0] = '\0';
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_430);
  local_450 = &local_440;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_440 = *puVar9;
    lStack_438 = plVar5[3];
  }
  else {
    local_440 = *puVar9;
    local_450 = (ulong *)*plVar5;
  }
  local_448 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_450);
  if (local_450 != &local_440) {
    operator_delete(local_450);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  __return_storage_ptr___00 = local_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::operator+(__return_storage_ptr___00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 &local_2d8);
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &aStack_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  std::
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  ::~vector(&local_100);
  return __return_storage_ptr___00;
}

Assistant:

std::string LinearRegression::generateGradients()
{
    size_t numberOfViews = _compiler->numberOfViews();

    std::vector<std::vector<ActualGradient>> actualGradients(numberOfViews);
        
    for(PartialGradient& pGrad : partialGradients)
    {
        // get view and aggregate corresponding to the query
        std::pair<size_t,size_t>& viewAggPair =
            pGrad.query->_aggregates[0]->_incoming[0];
        
        // Assign to view, the aggregate and the corresponding param, grad pair
        ActualGradient ag;
        ag.aggNum = viewAggPair.second;
        ag.incVars = pGrad.inputVariables;

        actualGradients[viewAggPair.first].push_back(ag);
    }

    // TODO: *Observations:* the view with all continuous aggregates only has one tuple
    // Ideally, we would have the corresponding params in an array so this
    // computation can be vectorized ! Ideally also the gradients should be a vector !
    
    std::string gradString =  offset(1)+"void computeGradient()\n"+offset(1)+"{\n"+
        offset(2)+"memset(grad, 0, numberOfParameters * "+
        std::to_string(sizeof(double))+");\n";

    std::string errorString =  offset(1)+"void computeError()\n"+offset(1)+"{\n"+
        offset(2)+"error = 0.0;\n";
    
    for (size_t viewID = 0; viewID < numberOfViews; ++viewID)
    {
        // TODO: check if this view has at least one free variable
        // If it does not then avoid the for loop, get the tuple reference and
        // adjust the offset
        bool viewHasFreeVars = _compiler->getView(viewID)->_fVars.any();
        size_t off = 3;
        
        if (!actualGradients[viewID].empty())
        {
            if (viewHasFreeVars)
            {
                gradString += offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(2)+"{\n";
                errorString += offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(2)+"{\n";
            }
            else
            {
                gradString += offset(2)+"V"+std::to_string(viewID)+
                    "_tuple& tuple = V"+std::to_string(viewID)+"[0];\n";
                errorString += offset(2)+"V"+std::to_string(viewID)+
                    "_tuple& tuple = V"+std::to_string(viewID)+"[0];\n";
                off = 2;
            }
        }
        
        for (ActualGradient& ag : actualGradients[viewID])
        {
            size_t prevGradID = 1000;
            size_t prevParamID = 1000;

            // TODO: TODO: We go at great length to avoid adding errors twice
            // here, this could surely be simplified by adding each combination
            // to actualGradients only once!
            
            for (size_t i = 0; i < ag.incVars.size(); i++)
            {
                size_t& gradID = ag.incVars[i].first;
                size_t& paramID = ag.incVars[i].second;

                if (gradID == labelID)
                    continue;

                if (prevGradID != paramID || prevParamID != gradID) 
                    errorString += offset(off)+ "error += ";

                if (gradID == paramID &&
                    (prevGradID != paramID || prevParamID != gradID))
                    errorString += "0.5 * ";
                
                if (_categoricalFeatures[gradID])
                {   
                    gradString += offset(off)+"grad[index_"+getAttributeName(gradID)+
                        "[tuple."+getAttributeName(gradID)+"]] += ";

                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params[index_"+getAttributeName(gradID)+
                            "[tuple."+getAttributeName(gradID)+"]] * ";
                }
                else
                {
                    gradString += offset(off)+"grad["+
                        std::to_string(_parameterIndex[gradID])+"] += ";
                    
                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params["+
                            std::to_string(_parameterIndex[gradID])+"] * ";
                }
                
                gradString += "tuple.aggregates["+std::to_string(ag.aggNum)+"] * ";

                if (prevGradID != paramID || prevParamID != gradID)
                    errorString += "tuple.aggregates["+std::to_string(ag.aggNum)+"] * ";
            
                if (_categoricalFeatures[paramID])
                {
                    gradString += "params[index_"+getAttributeName(paramID)+
                        "[tuple."+getAttributeName(paramID)+"]];\n";
                    
                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params[index_"+getAttributeName(paramID)+
                            "[tuple."+getAttributeName(paramID)+"]];\n";
                }
                else
                {
                    // gradString += "param_"+getAttributeName(paramID)+";\n";
                    gradString += "params["+
                        std::to_string(_parameterIndex[paramID])+"];\n";

                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params["+
                            std::to_string(_parameterIndex[paramID])+"];\n";
                }

                prevGradID = gradID;
                prevParamID = paramID;
            }
        }
        if (!actualGradients[viewID].empty() && viewHasFreeVars)
        {    
            gradString += offset(2)+"}\n";
            errorString += offset(2)+"}\n";
        }
        
    }
    gradString += offset(2)+"for (size_t j = 0; j < numberOfParameters; ++j)\n"+
        offset(3)+"grad[j] /= tuple.aggregates[0];\n"+
        offset(1)+"}\n\n";

    std::string labelStr = std::to_string(_parameterIndex[labelID]);
    
    errorString +=  offset(2)+"error /= tuple.aggregates[0];\n\n"+
        offset(2)+"double paramNorm = 0.0;\n"+
        offset(2)+"/* Adding the regulariser to the error */\n"+
        offset(2)+"for (size_t j = 1; j < numberOfParameters; ++j)\n"+
        offset(3)+"paramNorm += params[j] * params[j];\n"+
        offset(2)+"paramNorm -= params["+labelStr+"] * params["+labelStr+"];\n\n"+
        offset(2)+"error += lambda[1] * paramNorm;\n"+
        offset(1)+"}\n";

    return gradString + errorString;
}